

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  undefined8 uVar6;
  ImGuiTableSettings *p;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  if (pcVar4 != (char *)0x0) {
    p = (ImGuiTableSettings *)(pcVar4 + 4);
    do {
      if ((p->ID != 0) && (uVar2 = p->SaveFlags, (uVar2 & 0xf) != 0)) {
        iVar3 = (buf->Buf).Size;
        iVar5 = iVar3 + -1;
        if (iVar3 == 0) {
          iVar5 = 0;
        }
        ImGuiTextBuffer::reserve(buf,iVar5 + p->ColumnsCount * 0x32 + 0x1e);
        ImGuiTextBuffer::appendf
                  (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)p->ID,
                   (ulong)(uint)(int)p->ColumnsCount);
        fVar1 = p->RefScale;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
        }
        if ('\0' < p->ColumnsCount) {
          pbVar7 = (byte *)((long)&p[1].RefScale + 3);
          uVar9 = 0;
          do {
            bVar10 = *(int *)(pbVar7 + -7) != 0 || (uVar2 & 7) != 0;
            if (((uVar2 & 8) != 0) && (*(int *)(pbVar7 + -7) == 0 && (uVar2 & 7) == 0)) {
              bVar10 = pbVar7[-1] != 0xff;
            }
            if (bVar10) {
              ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar9);
              if (*(int *)(pbVar7 + -7) != 0) {
                ImGuiTextBuffer::appendf(buf," UserID=%08X");
              }
              if ((uVar2 & 1) != 0) {
                if ((*pbVar7 & 8) != 0) {
                  ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar7 + -0xb));
                }
                if ((*pbVar7 & 8) == 0) {
                  ImGuiTextBuffer::appendf
                            (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar7 + -0xb));
                }
              }
              if ((uVar2 & 4) != 0) {
                ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar7 >> 2 & 1));
              }
              if ((uVar2 & 2) != 0) {
                ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar7[-2]);
              }
              if (((uVar2 & 8) != 0) && ((int)(char)pbVar7[-1] != 0xffffffff)) {
                uVar6 = 0x5e;
                if ((*pbVar7 & 3) == 1) {
                  uVar6 = 0x76;
                }
                ImGuiTextBuffer::appendf(buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar7[-1],uVar6);
              }
              ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
            }
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
            pbVar7 = pbVar7 + 0xc;
          } while ((int)uVar8 < (int)p->ColumnsCount);
        }
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      }
      p = ImChunkStream<ImGuiTableSettings>::next_chunk(&ctx->SettingsTables,p);
    } while (p != (ImGuiTableSettings *)0x0);
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}